

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# idx2Common.cpp
# Opt level: O0

error<idx2::idx2_err_code> __thiscall
idx2::ComputeLocalBricksChunksFilesOrders::anon_class_1_0_00000001::operator()
          (anon_class_1_0_00000001 *this)

{
  long *in_FS_OFFSET;
  anon_class_1_0_00000001 *this_local;
  error<idx2::idx2_err_code> Err;
  
  error<idx2::idx2_err_code>::error
            ((error<idx2::idx2_err_code> *)&this_local,ChunksPerFileNotPowerOf2,false,"");
  *(char **)(*in_FS_OFFSET + -0xe80) =
       "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/idx2Common.cpp"
  ;
  *(undefined4 *)(*in_FS_OFFSET + -0xf80) = 0x219;
  return _this_local;
}

Assistant:

idx2_For (int, I, 0, Idx2->NLevels)
  {
    stack_string<64> BricksOrderInChunk;
    stack_string<64> ChunksOrderInFile;
    stack_string<64> FilesOrder;

    /* bricks order in chunk */
    {
      Idx2->BricksPerChunk[I] =
        1 << Min((u8)Log2Ceil(Idx2->BricksPerChunk[0]), Idx2->BricksOrderStr[I].Len);
      BricksOrderInChunk.Len = Log2Ceil(Idx2->BricksPerChunk[I]);
      Idx2->BricksPerChunk3s[I] = v3i(1);
      idx2_For (int, J, 0, BricksOrderInChunk.Len)
      {
        char C = Idx2->BricksOrderStr[I][Idx2->BricksOrderStr[I].Len - J - 1];
        Idx2->BricksPerChunk3s[I][C - 'X'] *= 2;
        BricksOrderInChunk[BricksOrderInChunk.Len - J - 1] = C;
      }
      Idx2->BricksOrderInChunk[I] =
        EncodeTransformOrder(stref(BricksOrderInChunk.Data, BricksOrderInChunk.Len));
      idx2_Assert(Idx2->BricksPerChunk[I] = Prod(Idx2->BricksPerChunk3s[I]));
    }

    /* chunks order in file */
    {
      Idx2->NChunks3[I] =
        (Idx2->NBricks3[I] + Idx2->BricksPerChunk3s[I] - 1) / Idx2->BricksPerChunk3s[I];
      Idx2->ChunksPerFile[I] = 1 << Min((u8)Log2Ceil(Idx2->ChunksPerFile[0]),
                                         (u8)(Idx2->BricksOrderStr[I].Len - BricksOrderInChunk.Len));
      idx2_Assert(Idx2->BricksOrderStr[I].Len >= BricksOrderInChunk.Len);
      ChunksOrderInFile.Len = Log2Ceil(Idx2->ChunksPerFile[I]);
      Idx2->ChunksPerFile3s[I] = v3i(1);
      idx2_For (int, J, 0, ChunksOrderInFile.Len)
      {
        char C = Idx2->BricksOrderStr[I][Idx2->BricksOrderStr[I].Len - BricksOrderInChunk.Len - J - 1];
        Idx2->ChunksPerFile3s[I][C - 'X'] *= 2;
        ChunksOrderInFile[ChunksOrderInFile.Len - J - 1] = C;
      }
      Idx2->ChunksOrderInFile[I] =
        EncodeTransformOrder(stref(ChunksOrderInFile.Data, ChunksOrderInFile.Len));
      idx2_Assert(Idx2->ChunksPerFile[I] == Prod(Idx2->ChunksPerFile3s[I]));
      Idx2->NFiles3[I] =
        (Idx2->NChunks3[I] + Idx2->ChunksPerFile3s[I] - 1) / Idx2->ChunksPerFile3s[I];
    }

    /* global chunk orders (not being used for now) */
    {
      stack_string<64> ChunksOrder;
      int ChunksPerVol = 1 << (Idx2->BricksOrderStr[I].Len - BricksOrderInChunk.Len);
      idx2_Assert(Idx2->BricksOrderStr[I].Len >= BricksOrderInChunk.Len);
      ChunksOrder.Len = Log2Ceil(ChunksPerVol);
      idx2_For (int, J, 0, ChunksOrder.Len)
      {
        char C = Idx2->BricksOrderStr[I][Idx2->BricksOrderStr[I].Len - BricksOrderInChunk.Len - J - 1];
        ChunksOrder[ChunksOrder.Len - J - 1] = C;
      }
      Idx2->ChunksOrder[I] = EncodeTransformOrder(stref(ChunksOrder.Data, ChunksOrder.Len));
      Resize(&Idx2->ChunksOrderStr, Idx2->NLevels);
      Idx2->ChunksOrderStr[I].Len = DecodeTransformOrder(
        Idx2->ChunksOrder[I], Idx2->NChunks3[I], Idx2->ChunksOrderStr[I].Data);
    }

    /* files order */
    {
      int FilesPerVol =
        1 << (Idx2->BricksOrderStr[I].Len - BricksOrderInChunk.Len - ChunksOrderInFile.Len);
      // TODO: the following check may fail if the brick size is too close to the size of the
      // volume, and we set NLevels too high
      idx2_Assert(Idx2->BricksOrderStr[I].Len >= BricksOrderInChunk.Len + ChunksOrderInFile.Len);
      FilesOrder.Len = Log2Ceil(FilesPerVol);
      idx2_For (int, J, 0, FilesOrder.Len)
      {
        char C = Idx2->BricksOrderStr[I][Idx2->BricksOrderStr[I].Len - BricksOrderInChunk.Len -
                                         ChunksOrderInFile.Len - J - 1];
        FilesOrder[FilesOrder.Len - J - 1] = C;
      }
      Idx2->FilesOrder[I] = EncodeTransformOrder(stref(FilesOrder.Data, FilesOrder.Len));
      Resize(&Idx2->FilesOrderStr, Idx2->NLevels);
      Idx2->FilesOrderStr[I].Len =
        DecodeTransformOrder(Idx2->FilesOrder[I], Idx2->NFiles3[I], Idx2->FilesOrderStr[I].Data);
    }
  }